

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O1

bool __thiscall LEFReader::parseForeign(LEFReader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  _Alloc_hider _Var5;
  _Alloc_hider __nptr;
  token_t tVar6;
  int *piVar7;
  undefined8 uVar8;
  bool bVar9;
  string cellname;
  string ynum;
  string xnum;
  string local_c0;
  double local_98;
  string local_90;
  string local_70;
  string local_50;
  
  paVar1 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  local_50._M_dataplus._M_p = (pointer)paVar3;
  tVar6 = tokenize(this,&local_90);
  this->m_curtok = tVar6;
  if (tVar6 != TOK_IDENT) {
LAB_0012cdcd:
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"Expected the cell name\n","");
    error(this,&local_c0);
    goto LAB_0012ceaa;
  }
  tVar6 = tokenize(this,&local_50);
  this->m_curtok = tVar6;
  if (tVar6 == TOK_SEMICOL) {
    bVar9 = true;
    (*this->_vptr_LEFReader[5])(0,0,this,&local_90);
    goto LAB_0012cec3;
  }
  if (tVar6 == TOK_NUMBER) {
    tVar6 = tokenize(this,&local_70);
    this->m_curtok = tVar6;
    if (tVar6 == TOK_NUMBER) {
      tVar6 = tokenize(this,&this->m_tokstr);
      __nptr._M_p = local_50._M_dataplus._M_p;
      this->m_curtok = tVar6;
      if (tVar6 == TOK_SEMICOL) {
        piVar7 = __errno_location();
        iVar4 = *piVar7;
        *piVar7 = 0;
        local_98 = strtod(__nptr._M_p,(char **)&local_c0);
        _Var5._M_p = local_70._M_dataplus._M_p;
        if (local_c0._M_dataplus._M_p == __nptr._M_p) {
          std::__throw_invalid_argument("stod");
          goto LAB_0012cf9a;
        }
        if (*piVar7 == 0) {
          *piVar7 = iVar4;
        }
        else if (*piVar7 == 0x22) {
          std::__throw_out_of_range("stod");
          goto LAB_0012cdcd;
        }
        iVar4 = *piVar7;
        *piVar7 = 0;
        strtod(local_70._M_dataplus._M_p,(char **)&local_c0);
        if (local_c0._M_dataplus._M_p == _Var5._M_p) {
LAB_0012cf9a:
          uVar8 = std::__throw_invalid_argument("stod");
          if ((int *)local_c0._M_dataplus._M_p != piVar7) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar2) {
            operator_delete(local_70._M_dataplus._M_p,
                            CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                     local_70.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar3) {
            operator_delete(local_50._M_dataplus._M_p,
                            CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                     local_50.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,
                            CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                     local_90.field_2._M_local_buf[0]) + 1);
          }
          _Unwind_Resume(uVar8);
        }
        if (*piVar7 == 0) {
LAB_0012cf6b:
          *piVar7 = iVar4;
        }
        else if (*piVar7 == 0x22) {
          std::__throw_out_of_range("stod");
          goto LAB_0012cf6b;
        }
        bVar9 = true;
        (*this->_vptr_LEFReader[5])(local_98,this,&local_90);
        goto LAB_0012cec3;
      }
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Expected a semicolon\n","");
      error(this,&local_c0);
    }
    else {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Expected a number\n","");
      error(this,&local_c0);
    }
  }
  else {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"Expected a number or semicolon\n","");
    error(this,&local_c0);
  }
LAB_0012ceaa:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  bVar9 = false;
LAB_0012cec3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar3) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return bVar9;
}

Assistant:

bool LEFReader::parseForeign()
{
    // FOREIGN <cellname> [<number> <number>] ; 

    std::string cellname;
    std::string xnum;
    std::string ynum;

    m_curtok = tokenize(cellname);
    if (m_curtok != TOK_IDENT)
    {
        error("Expected the cell name\n");
        return false;
    }

    // foreign point is optional

    m_curtok = tokenize(xnum);
    if (m_curtok == TOK_NUMBER)
    {
        m_curtok = tokenize(ynum);
        if (m_curtok != TOK_NUMBER)
        {
            error("Expected a number\n");
            return false;
        }

        m_curtok = tokenize(m_tokstr);
        if (m_curtok != TOK_SEMICOL)
        {
            error("Expected a semicolon\n");
            return false;
        }

        double xnumd, ynumd;
        try
        {
            xnumd = std::stod(xnum);
            ynumd = std::stod(ynum);
        }
        catch(const std::invalid_argument& ia)
        {
            error(ia.what());
        }

        onForeign(cellname, xnumd, ynumd);
        return true;
    }
    else if (m_curtok != TOK_SEMICOL)
    {
        error("Expected a number or semicolon\n");
        return false;
    }    

    onForeign(cellname, 0, 0);

    return true;
}